

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DRAIN_LIGHT(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  _Bool _Var2;
  short sVar3;
  wchar_t wVar4;
  wchar_t slot;
  object *poVar5;
  short sVar6;
  
  wVar4 = effect_calculate_value(context,false);
  slot = slot_by_name(player,"light");
  poVar5 = slot_object(player,slot);
  if (poVar5 != (object *)0x0) {
    _Var2 = flag_has_dbg(poVar5->flags,6,0x19,"obj->flags","OF_NO_FUEL");
    if ((!_Var2) && (0 < poVar5->timeout)) {
      sVar3 = poVar5->timeout - (short)wVar4;
      sVar6 = 1;
      if (1 < sVar3) {
        sVar6 = sVar3;
      }
      poVar5->timeout = sVar6;
      if (player->timed[2] == 0) {
        msg("Your light dims.");
        context->ident = true;
      }
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x40000;
    }
  }
  return true;
}

Assistant:

bool effect_handler_DRAIN_LIGHT(effect_handler_context_t *context)
{
	int drain = effect_calculate_value(context, false);

	int light_slot = slot_by_name(player, "light");
	struct object *obj = slot_object(player, light_slot);

	if (obj && !of_has(obj->flags, OF_NO_FUEL) && (obj->timeout > 0)) {
		/* Reduce fuel */
		obj->timeout -= drain;
		if (obj->timeout < 1) obj->timeout = 1;

		/* Notice */
		if (!player->timed[TMD_BLIND]) {
			msg("Your light dims.");
			context->ident = true;
		}

		/* Redraw stuff */
		player->upkeep->redraw |= (PR_EQUIP);
	}

	return true;
}